

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2d65b::CleanTestCleanDyndepMissing::Run(CleanTestCleanDyndepMissing *this)

{
  Test *pTVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  size_type sVar5;
  TimeStamp TVar6;
  allocator<char> local_229;
  string local_228;
  allocator<char> local_201;
  string local_200;
  undefined1 local_1e0 [8];
  string err;
  undefined1 local_1b8 [8];
  Cleaner cleaner;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  ManifestParserOptions local_1c;
  int local_14;
  CleanTestCleanDyndepMissing *pCStack_10;
  int fail_count;
  CleanTestCleanDyndepMissing *this_local;
  
  pCStack_10 = this;
  local_14 = testing::Test::AssertionFailures(g_current_test);
  ManifestParserOptions::ManifestParserOptions(&local_1c);
  AssertParse(&(this->super_CleanTest).super_StateTestWithBuiltinRules.state_,
              "build out: cat in || dd\n  dyndep = dd\n",local_1c);
  iVar4 = local_14;
  iVar3 = testing::Test::AssertionFailures(g_current_test);
  if (iVar4 == iVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"in",&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_79);
    VirtualFileSystem::Create(&(this->super_CleanTest).fs_,&local_40,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"out",&local_a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"",&local_c9);
    VirtualFileSystem::Create(&(this->super_CleanTest).fs_,&local_a0,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"out.imp",&local_f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"",(allocator<char> *)&cleaner.field_0x97);
    VirtualFileSystem::Create(&(this->super_CleanTest).fs_,&local_f0,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator((allocator<char> *)&cleaner.field_0x97);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
    Cleaner::Cleaner((Cleaner *)local_1b8,
                     &(this->super_CleanTest).super_StateTestWithBuiltinRules.state_,
                     &(this->super_CleanTest).config_,
                     &(this->super_CleanTest).fs_.super_DiskInterface);
    pTVar1 = g_current_test;
    iVar4 = Cleaner::cleaned_files_count((Cleaner *)local_1b8);
    bVar2 = testing::Test::Check
                      (pTVar1,iVar4 == 0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                       ,0x152,"0 == cleaner.cleaned_files_count()");
    pTVar1 = g_current_test;
    if (bVar2) {
      iVar4 = Cleaner::CleanAll((Cleaner *)local_1b8,false);
      testing::Test::Check
                (pTVar1,iVar4 == 0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                 ,0x153,"0 == cleaner.CleanAll()");
      pTVar1 = g_current_test;
      iVar4 = Cleaner::cleaned_files_count((Cleaner *)local_1b8);
      testing::Test::Check
                (pTVar1,iVar4 == 1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                 ,0x154,"1 == cleaner.cleaned_files_count()");
      pTVar1 = g_current_test;
      sVar5 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&(this->super_CleanTest).fs_.files_removed_);
      testing::Test::Check
                (pTVar1,sVar5 == 1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                 ,0x155,"1u == fs_.files_removed_.size()");
      std::__cxx11::string::string((string *)local_1e0);
      pTVar1 = g_current_test;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"out",&local_201);
      TVar6 = VirtualFileSystem::Stat(&(this->super_CleanTest).fs_,&local_200,(string *)local_1e0);
      testing::Test::Check
                (pTVar1,TVar6 == 0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                 ,0x158,"0 == fs_.Stat(\"out\", &err)");
      std::__cxx11::string::~string((string *)&local_200);
      std::allocator<char>::~allocator(&local_201);
      pTVar1 = g_current_test;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"out.imp",&local_229);
      TVar6 = VirtualFileSystem::Stat(&(this->super_CleanTest).fs_,&local_228,(string *)local_1e0);
      testing::Test::Check
                (pTVar1,TVar6 == 1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                 ,0x159,"1 == fs_.Stat(\"out.imp\", &err)");
      std::__cxx11::string::~string((string *)&local_228);
      std::allocator<char>::~allocator(&local_229);
      std::__cxx11::string::~string((string *)local_1e0);
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
    }
    err.field_2._13_3_ = 0;
    err.field_2._M_local_buf[0xc] = !bVar2;
    Cleaner::~Cleaner((Cleaner *)local_1b8);
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(CleanTest, CleanDyndepMissing) {
  // Verify that a missing dyndep file is tolerated.
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build out: cat in || dd\n"
"  dyndep = dd\n"
  ));
  fs_.Create("in", "");
  fs_.Create("out", "");
  fs_.Create("out.imp", "");

  Cleaner cleaner(&state_, config_, &fs_);

  ASSERT_EQ(0, cleaner.cleaned_files_count());
  EXPECT_EQ(0, cleaner.CleanAll());
  EXPECT_EQ(1, cleaner.cleaned_files_count());
  EXPECT_EQ(1u, fs_.files_removed_.size());

  string err;
  EXPECT_EQ(0, fs_.Stat("out", &err));
  EXPECT_EQ(1, fs_.Stat("out.imp", &err));
}